

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

void nni_dialer_rele(nni_dialer *d)

{
  byte local_12;
  _Bool reap;
  nni_dialer *d_local;
  
  nni_mtx_lock(&dialers_lk);
  if (d->d_ref < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/dialer.c",
              0x16c,"d->d_ref > 0");
  }
  d->d_ref = d->d_ref + -1;
  local_12 = 0;
  if (d->d_ref == 0) {
    local_12 = d->d_closed;
  }
  nni_mtx_unlock(&dialers_lk);
  if ((local_12 & 1) != 0) {
    nni_dialer_reap(d);
  }
  return;
}

Assistant:

void
nni_dialer_rele(nni_dialer *d)
{
	bool reap;

	nni_mtx_lock(&dialers_lk);
	NNI_ASSERT(d->d_ref > 0);
	d->d_ref--;
	reap = ((d->d_ref == 0) && (d->d_closed));
	nni_mtx_unlock(&dialers_lk);

	if (reap) {
		nni_dialer_reap(d);
	}
}